

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.h
# Opt level: O2

char * lyd_get_value(lyd_node *node)

{
  lysc_node *plVar1;
  char *pcVar2;
  
  if (node != (lyd_node *)0x0) {
    plVar1 = node->schema;
    if (plVar1 == (lysc_node *)0x0) {
      return (char *)node[1].prev;
    }
    if ((plVar1->nodetype & 0xc) != 0) {
      if (*(char **)(node + 1) != (char *)0x0) {
        return *(char **)(node + 1);
      }
      pcVar2 = lyd_value_get_canonical(plVar1->module->ctx,(lyd_value *)(node + 1));
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static inline const char *
lyd_get_value(const struct lyd_node *node)
{
    if (!node) {
        return NULL;
    }

    if (!node->schema) {
        return ((const struct lyd_node_opaq *)node)->value;
    } else if (node->schema->nodetype & LYD_NODE_TERM) {
        const struct lyd_value *value = &((const struct lyd_node_term *)node)->value;

        return value->_canonical ? value->_canonical : lyd_value_get_canonical(LYD_CTX(node), value);
    }

    return NULL;
}